

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

int uint32_log2(uint32_t x)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int a4;
  int a3;
  int a2;
  int a1;
  int a0;
  uint32_t x_local;
  
  if (x == 0) {
    a0 = -0x80000000;
  }
  else {
    iVar2 = 0;
    if (0xffff < x) {
      iVar2 = 0x10;
    }
    uVar3 = x >> (sbyte)iVar2;
    uVar4 = 0 >> (sbyte)iVar2;
    if (0xff < uVar3) {
      uVar4 = 8;
    }
    bVar1 = (byte)uVar4 & 0x1f;
    uVar3 = uVar3 >> bVar1;
    uVar5 = 0 >> bVar1;
    if (0xf < uVar3) {
      uVar5 = 4;
    }
    bVar1 = (byte)uVar5 & 0x1f;
    uVar3 = uVar3 >> bVar1;
    uVar6 = 0 >> bVar1;
    if (3 < uVar3) {
      uVar6 = 2;
    }
    bVar1 = (byte)uVar6 & 0x1f;
    uVar7 = 0 >> bVar1;
    if (1 < uVar3 >> bVar1) {
      uVar7 = 1;
    }
    a0 = uVar7 + uVar6 + uVar5 + uVar4 + iVar2;
  }
  return a0;
}

Assistant:

int uint32_log2( uint32_t x )
{
    int a0, a1, a2, a3, a4;
    if (x == 0) return INT_MIN;
    a4 = (x > 0xffff)?16:0;
    x >>= a4;
    a3 = (x > 0xff)?8:0;
    x >>= a3;
    a2 = (x > 0xf)?4:0;
    x >>= a2;
    a1 = (x > 0x3)?2:0;
    x >>= a1;
    a0 = (x > 0x1)?1:0;
    return a0 + a1 + a2 + a3 + a4;
}